

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

VariablePairPtr __thiscall libcellml::AnyCellmlElement::variablePair(AnyCellmlElement *this)

{
  int iVar1;
  AnyCellmlElementImpl *pAVar2;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  VariablePairPtr VVar4;
  
  iVar1 = *(int *)*in_RSI;
  if ((iVar1 == 5) || (iVar1 == 2)) {
    puVar3 = (undefined8 *)
             std::__any_caster<std::shared_ptr<libcellml::VariablePair>>
                       ((any *)((int *)*in_RSI + 2));
    if (puVar3 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    this->mPimpl = (AnyCellmlElementImpl *)*puVar3;
    pAVar2 = (AnyCellmlElementImpl *)puVar3[1];
    this[1].mPimpl = pAVar2;
    in_RDX._M_pi = extraout_RDX;
    if (pAVar2 != (AnyCellmlElementImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pAVar2->mItem)._M_manager = *(int *)&(pAVar2->mItem)._M_manager + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pAVar2->mItem)._M_manager = *(int *)&(pAVar2->mItem)._M_manager + 1;
      }
    }
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  VVar4.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  VVar4.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePairPtr)
         VVar4.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePairPtr AnyCellmlElement::variablePair() const
{
    if ((mPimpl->mType == CellmlElementType::CONNECTION)
        || (mPimpl->mType == CellmlElementType::MAP_VARIABLES)) {
        try {
            return std::any_cast<VariablePairPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}